

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

bool __thiscall PDA::containsState(PDA *this,string *stateName)

{
  bool bVar1;
  __type _Var2;
  reference ppSVar3;
  string *__lhs;
  State *state;
  iterator __end1;
  iterator __begin1;
  vector<State_*,_std::allocator<State_*>_> *__range1;
  string *stateName_local;
  PDA *this_local;
  
  __end1 = std::vector<State_*,_std::allocator<State_*>_>::begin(&this->statesQ);
  state = (State *)std::vector<State_*,_std::allocator<State_*>_>::end(&this->statesQ);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>
                                *)&state);
    if (!bVar1) {
      return false;
    }
    ppSVar3 = __gnu_cxx::
              __normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
              operator*(&__end1);
    __lhs = State::getName_abi_cxx11_(*ppSVar3);
    _Var2 = std::operator==(__lhs,stateName);
    if (_Var2) break;
    __gnu_cxx::__normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
    operator++(&__end1);
  }
  return true;
}

Assistant:

bool PDA::containsState(std::string stateName) {
    for (auto state: statesQ) {
        if (state->getName() == stateName) {
            return true;
        }
    }
    return false;
}